

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::decoder_etc_block::get_block_colors5_g
               (int *pBlock_colors,color32 *base_color5,uint32_t inten_table)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int *pInten_table;
  int g;
  
  uVar1 = (uint)*(byte *)(in_RSI + 1) << 3 | (int)(uint)*(byte *)(in_RSI + 1) >> 2;
  lVar3 = (ulong)in_EDX * 0x10;
  iVar2 = clamp255(uVar1 + *(int *)(g_etc1_inten_tables + lVar3));
  *in_RDI = iVar2;
  iVar2 = clamp255(uVar1 + *(int *)(g_etc1_inten_tables + lVar3 + 4));
  in_RDI[1] = iVar2;
  iVar2 = clamp255(uVar1 + *(int *)(g_etc1_inten_tables + lVar3 + 8));
  in_RDI[2] = iVar2;
  iVar2 = clamp255(uVar1 + *(int *)(g_etc1_inten_tables + lVar3 + 0xc));
  in_RDI[3] = iVar2;
  return;
}

Assistant:

static void get_block_colors5_g(int* pBlock_colors, const color32& base_color5, uint32_t inten_table)
		{
			const int g = (base_color5.g << 3) | (base_color5.g >> 2);

			const int* pInten_table = g_etc1_inten_tables[inten_table];

			pBlock_colors[0] = clamp255(g + pInten_table[0]);
			pBlock_colors[1] = clamp255(g + pInten_table[1]);
			pBlock_colors[2] = clamp255(g + pInten_table[2]);
			pBlock_colors[3] = clamp255(g + pInten_table[3]);
		}